

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O2

native_object_property * __thiscall mjs::native_object::find(native_object *this,char *name)

{
  int iVar1;
  gc_vector<mjs::native_object::native_object_property> *this_00;
  gc_table *pgVar2;
  native_object_property *pnVar3;
  native_object_property *p;
  native_object_property *__s1;
  
  this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
            ::dereference(&this->native_properties_,(this->super_object).heap_);
  pgVar2 = gc_vector<mjs::native_object::native_object_property>::tab(this_00);
  __s1 = (native_object_property *)(pgVar2 + 1);
  pnVar3 = gc_vector<mjs::native_object::native_object_property>::end(this_00);
  while( true ) {
    if (__s1 == pnVar3) {
      return (native_object_property *)0x0;
    }
    iVar1 = strcmp(__s1->name,name);
    if (iVar1 == 0) break;
    __s1 = __s1 + 1;
  }
  return __s1;
}

Assistant:

native_object::native_object_property* native_object::find(const char* name) const {
    for (auto& p: native_properties_.dereference(heap())) {
        if (!strcmp(p.name, name)) {
            return &p;
        }
    }
    return nullptr;
}